

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

int __thiscall
booster::aio::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  error_category *peVar2;
  native_type __fd_00;
  int fd;
  int extraout_EAX;
  int *piVar3;
  undefined4 in_register_00000034;
  
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    fd = ::accept(__fd_00,(sockaddr *)0x0,(socklen_t *)0x0);
    if (-1 < fd) goto LAB_0016573a;
    piVar3 = __errno_location();
    peVar2 = syscat;
    iVar1 = *piVar3;
  } while (iVar1 == 4);
  if (fd == -1) {
    __addr->sa_family = (short)iVar1;
    __addr->sa_data[0] = (char)((uint)iVar1 >> 0x10);
    __addr->sa_data[1] = (char)((uint)iVar1 >> 0x18);
    *(error_category **)(__addr->sa_data + 6) = peVar2;
    return iVar1;
  }
LAB_0016573a:
  basic_io_device::assign((basic_io_device *)CONCAT44(in_register_00000034,__fd),fd);
  return extraout_EAX;
}

Assistant:

void acceptor::accept(stream_socket &target,system::error_code &e)
{
	native_type new_fd = invalid_socket;
	#ifndef BOOSTER_WIN32
	for(;;) {
		new_fd = ::accept(native(),0,0);
		if(new_fd < 0 && errno==EINTR)
			continue;
		break;
	}
	#else
	new_fd = ::accept(native(),0,0);
	#endif

	if(new_fd == invalid_socket) {
		e=geterror();
		return;
	}

	target.assign(new_fd);
	return;
}